

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFBoundingBox.cpp
# Opt level: O3

bool ZXing::Pdf417::BoundingBox::Merge
               (Nullable<ZXing::Pdf417::BoundingBox> *leftBox,
               Nullable<ZXing::Pdf417::BoundingBox> *rightBox,
               Nullable<ZXing::Pdf417::BoundingBox> *result)

{
  int iVar1;
  undefined7 uVar2;
  bool bVar3;
  long lVar4;
  BoundingBox *pBVar5;
  BoundingBox *pBVar6;
  byte bVar7;
  BoundingBox box;
  BoundingBox local_98;
  
  bVar7 = 0;
  if (leftBox->m_hasValue == false) {
    lVar4 = 0x10;
  }
  else {
    if (rightBox->m_hasValue != false) {
      BoundingBox(&local_98);
      bVar3 = Create((leftBox->m_value)._imgWidth,(leftBox->m_value)._imgHeight,
                     &(leftBox->m_value)._topLeft,&(leftBox->m_value)._bottomLeft,
                     &(rightBox->m_value)._topRight,&(rightBox->m_value)._bottomRight,&local_98);
      if (!bVar3) {
        return bVar3;
      }
      result->m_hasValue = true;
      pBVar5 = &local_98;
      pBVar6 = &result->m_value;
      for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
        iVar1 = pBVar5->_imgHeight;
        pBVar6->_imgWidth = pBVar5->_imgWidth;
        pBVar6->_imgHeight = iVar1;
        pBVar5 = (BoundingBox *)((long)pBVar5 + ((ulong)bVar7 * -2 + 1) * 8);
        pBVar6 = (BoundingBox *)((long)pBVar6 + (ulong)bVar7 * -0x10 + 8);
      }
      return bVar3;
    }
    lVar4 = 0x10;
    rightBox = leftBox;
  }
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    uVar2 = *(undefined7 *)&rightBox->field_0x1;
    result->m_hasValue = rightBox->m_hasValue;
    *(undefined7 *)&result->field_0x1 = uVar2;
    rightBox = (Nullable<ZXing::Pdf417::BoundingBox> *)&rightBox->m_value;
    result = (Nullable<ZXing::Pdf417::BoundingBox> *)&result->m_value;
  }
  return true;
}

Assistant:

bool
BoundingBox::Merge(const Nullable<BoundingBox>& leftBox, const Nullable<BoundingBox>& rightBox, Nullable<BoundingBox>& result)
{
	if (leftBox == nullptr) {
		result = rightBox;
		return true;
	}
	if (rightBox == nullptr) {
		result = leftBox;
		return true;
	}
	BoundingBox box;
	if (Create(leftBox.value()._imgWidth, leftBox.value()._imgHeight, leftBox.value()._topLeft, leftBox.value()._bottomLeft, rightBox.value()._topRight, rightBox.value()._bottomRight, box)) {
		result = box;
		return true;
	}
	return false;
}